

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Gia_ManSuperCollectAnd_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  
  for (; ((ulong)pObj & 1) == 0; pObj = Gia_ObjChild1(pObj)) {
    iVar1 = Gia_ObjIsAndReal(p,pObj);
    if (iVar1 == 0) break;
    iVar1 = Gia_ObjRefNum(p,pObj);
    if ((1 < iVar1) || (100 < p->vSuper->nSize)) break;
    Gia_ManSuperCollectAnd_rec
              (p,(Gia_Obj_t *)
                 ((ulong)((uint)*(undefined8 *)pObj >> 0x1d & 1) |
                 (ulong)(pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff))));
  }
  p_00 = p->vSuper;
  iVar1 = Gia_ObjToLit(p,pObj);
  Vec_IntPush(p_00,iVar1);
  return;
}

Assistant:

static inline void Gia_ManSuperCollectAnd_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_IsComplement(pObj) || 
        !Gia_ObjIsAndReal(p, pObj) || 
        Gia_ObjRefNum(p, pObj) > 1 || 
//        Gia_ObjRefNum(p, pObj) > 3 || 
//        (Gia_ObjRefNum(p, pObj) == 2 && (Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) == 1 || Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) == 1)) || 
        Vec_IntSize(p->vSuper) > STR_SUPER )
    {
        Vec_IntPush( p->vSuper, Gia_ObjToLit(p, pObj) );
        return;
    }
    Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild0(pObj) );
    Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild1(pObj) );
}